

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rwrEva.c
# Opt level: O2

void Rwr_ScoresClean(Rwr_Man_t *p)

{
  Vec_Ptr_t *p_00;
  void *pvVar1;
  int i;
  int i_00;
  int i_01;
  
  for (i_00 = 0; i_00 < p->vClasses->nSize; i_00 = i_00 + 1) {
    p_00 = Vec_VecEntry(p->vClasses,i_00);
    for (i_01 = 0; i_01 < p_00->nSize; i_01 = i_01 + 1) {
      pvVar1 = Vec_PtrEntry(p_00,i_01);
      *(undefined2 *)((long)pvVar1 + 0xc) = 0;
      *(undefined4 *)((long)pvVar1 + 8) = 0;
    }
  }
  return;
}

Assistant:

void Rwr_ScoresClean( Rwr_Man_t * p )
{
    Vec_Ptr_t * vSubgraphs;
    Rwr_Node_t * pNode;
    int i, k;
    for ( i = 0; i < p->vClasses->nSize; i++ )
    {
        vSubgraphs = Vec_VecEntry( p->vClasses, i );
        Vec_PtrForEachEntry( Rwr_Node_t *, vSubgraphs, pNode, k )
            pNode->nScore = pNode->nGain = pNode->nAdded = 0;
    }
}